

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_LNE_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  switch(val) {
  case 1:
    pcVar2 = "DW_LNE_end_sequence";
    break;
  case 2:
    pcVar2 = "DW_LNE_set_address";
    break;
  case 3:
    pcVar2 = "DW_LNE_define_file";
    break;
  case 4:
    pcVar2 = "DW_LNE_set_discriminator";
    break;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    goto switchD_001cceb8_caseD_5;
  case 0x11:
    pcVar2 = "DW_LNE_HP_negate_is_UV_update";
    break;
  case 0x12:
    pcVar2 = "DW_LNE_HP_push_context";
    break;
  case 0x13:
    pcVar2 = "DW_LNE_HP_pop_context";
    break;
  case 0x14:
    pcVar2 = "DW_LNE_HP_set_file_line_column";
    break;
  case 0x15:
    pcVar2 = "DW_LNE_HP_set_routine_name";
    break;
  case 0x16:
    pcVar2 = "DW_LNE_HP_set_sequence";
    break;
  case 0x17:
    pcVar2 = "DW_LNE_HP_negate_post_semantics";
    break;
  case 0x18:
    pcVar2 = "DW_LNE_HP_negate_function_exit";
    break;
  case 0x19:
    pcVar2 = "DW_LNE_HP_negate_front_end_logical";
    break;
  case 0x20:
    pcVar2 = "DW_LNE_HP_define_proc";
    break;
  default:
    if (val == 0x80) {
      pcVar2 = "DW_LNE_HP_source_file_correlation";
    }
    else {
      if (val != 0xff) {
        return -1;
      }
      pcVar2 = "DW_LNE_hi_user";
    }
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_001cceb8_caseD_5:
  return iVar1;
}

Assistant:

int
dwarf_get_LNE_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_LNE_end_sequence:
        *s_out = "DW_LNE_end_sequence";
        return DW_DLV_OK;
    case DW_LNE_set_address:
        *s_out = "DW_LNE_set_address";
        return DW_DLV_OK;
    case DW_LNE_define_file:
        *s_out = "DW_LNE_define_file";
        return DW_DLV_OK;
    case DW_LNE_set_discriminator:
        *s_out = "DW_LNE_set_discriminator";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_is_UV_update:
        *s_out = "DW_LNE_HP_negate_is_UV_update";
        return DW_DLV_OK;
    case DW_LNE_HP_push_context:
        *s_out = "DW_LNE_HP_push_context";
        return DW_DLV_OK;
    case DW_LNE_HP_pop_context:
        *s_out = "DW_LNE_HP_pop_context";
        return DW_DLV_OK;
    case DW_LNE_HP_set_file_line_column:
        *s_out = "DW_LNE_HP_set_file_line_column";
        return DW_DLV_OK;
    case DW_LNE_HP_set_routine_name:
        *s_out = "DW_LNE_HP_set_routine_name";
        return DW_DLV_OK;
    case DW_LNE_HP_set_sequence:
        *s_out = "DW_LNE_HP_set_sequence";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_post_semantics:
        *s_out = "DW_LNE_HP_negate_post_semantics";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_function_exit:
        *s_out = "DW_LNE_HP_negate_function_exit";
        return DW_DLV_OK;
    case DW_LNE_HP_negate_front_end_logical:
        *s_out = "DW_LNE_HP_negate_front_end_logical";
        return DW_DLV_OK;
    case DW_LNE_HP_define_proc:
        *s_out = "DW_LNE_HP_define_proc";
        return DW_DLV_OK;
    case DW_LNE_HP_source_file_correlation:
        *s_out = "DW_LNE_HP_source_file_correlation";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x80. DW_LNE_lo_user */
    case DW_LNE_hi_user:
        *s_out = "DW_LNE_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}